

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::executeDefinition(Forth *this,Definition *definition)

{
  bool bVar1;
  ostream *poVar2;
  AbortException *this_00;
  long *plVar3;
  undefined8 in_RDX;
  code *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Xt local_1c;
  Definition *pDStack_18;
  Xt saved;
  Definition *definition_local;
  Forth *this_local;
  
  local_1c = this->executingWord;
  this->executingWord = definition->numberInVector;
  pDStack_18 = definition;
  definition_local = (Definition *)this;
  if (definition->code == 0) {
    this_00 = (AbortException *)
              __cxa_allocate_exception(0x10,definition,in_RDX,*(undefined8 *)&definition->field_0x8)
    ;
    std::operator+(&local_60,"Word \"",&definition->name);
    std::operator+(&local_40,&local_60,"\" has nullptr code");
    AbortException::AbortException(this_00,&local_40);
    __cxa_throw(this_00,&AbortException::typeinfo,AbortException::~AbortException);
  }
  bVar1 = isTraceCalls(this);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&definition->name);
    std::operator<<(poVar2," ");
  }
  local_98 = (code *)definition->code;
  plVar3 = (long *)((long)&this->CellSize + *(long *)&definition->field_0x8);
  if (((ulong)local_98 & 1) != 0) {
    local_98 = *(code **)(local_98 + *plVar3 + -1);
  }
  (*local_98)(plVar3);
  this->executingWord = local_1c;
  return;
}

Assistant:

void executeDefinition(struct Definition definition) {
				auto saved = executingWord;
				executingWord = definition.numberInVector;
				if (definition.code) {
					if (isTraceCalls()) {
						
						std::cout << definition.name << " ";
						// int i = forth_depth();
						// std::cerr << definition.name << " " << forth_depth();
						// while (i > 0) std::cerr << " " << forth_tocell(i--  - 1);
						// std::cerr<< std::endl;
					}
					((*this).*(definition.code))();
				}
				else {
					throw AbortException("Word \""+definition.name+"\" has nullptr code");
				}
				executingWord = saved;
			}